

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_bKGD(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uchar *chunk;
  uchar *local_18;
  
  local_18 = (uchar *)0x0;
  switch((info->color).colortype) {
  case LCT_GREY:
  case LCT_GREY_ALPHA:
    uVar1 = lodepng_chunk_init(&local_18,out,2,"bKGD");
    if (uVar1 != 0) {
      return uVar1;
    }
    local_18[8] = *(uchar *)((long)&info->background_r + 1);
    local_18[9] = (uchar)info->background_r;
    break;
  default:
    goto switchD_0015d43c_caseD_1;
  case LCT_RGB:
  case LCT_RGBA:
    uVar1 = lodepng_chunk_init(&local_18,out,6,"bKGD");
    if (uVar1 != 0) {
      return uVar1;
    }
    local_18[8] = *(uchar *)((long)&info->background_r + 1);
    local_18[9] = (uchar)info->background_r;
    local_18[10] = *(uchar *)((long)&info->background_g + 1);
    local_18[0xb] = (uchar)info->background_g;
    local_18[0xc] = *(uchar *)((long)&info->background_b + 1);
    local_18[0xd] = (uchar)info->background_b;
    break;
  case LCT_PALETTE:
    uVar1 = lodepng_chunk_init(&local_18,out,1,"bKGD");
    if (uVar1 != 0) {
      return uVar1;
    }
    local_18[8] = (uchar)info->background_r;
  }
  lodepng_chunk_generate_crc(local_18);
switchD_0015d43c_caseD_1:
  return 0;
}

Assistant:

static unsigned addChunk_bKGD(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk = 0;
  if(info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r >> 8);
    chunk[9] = (unsigned char)(info->background_r & 255);
  } else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 6, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r >> 8);
    chunk[9] = (unsigned char)(info->background_r & 255);
    chunk[10] = (unsigned char)(info->background_g >> 8);
    chunk[11] = (unsigned char)(info->background_g & 255);
    chunk[12] = (unsigned char)(info->background_b >> 8);
    chunk[13] = (unsigned char)(info->background_b & 255);
  } else if(info->color.colortype == LCT_PALETTE) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 1, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r & 255); /*palette index*/
  }
  if(chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}